

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

bool ON_GetConicEquationThrough6Points
               (int stride,double *points2d,double *conic,double *max_pivot,double *min_pivot,
               double *zero_pivot)

{
  undefined8 uVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  double *pdVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double M [5] [5];
  double N [5] [5];
  ON_2dPoint pts [6];
  double adStack_2a8 [10];
  double local_258 [5];
  double adStack_230 [12];
  double local_1d0;
  double local_1c8;
  double local_1b8;
  undefined8 uStack_1b0;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  undefined8 uStack_180;
  double local_178;
  double adStack_170 [7];
  undefined8 local_138;
  double local_120;
  undefined8 local_108;
  double local_f8;
  undefined8 local_d8;
  double local_d0;
  double local_a8;
  double adStack_a0 [14];
  
  if (conic == (double *)0x0) {
    return false;
  }
  conic[4] = 0.0;
  conic[5] = 0.0;
  conic[2] = 0.0;
  conic[3] = 0.0;
  *conic = 0.0;
  conic[1] = 0.0;
  if (max_pivot != (double *)0x0) {
    *max_pivot = 0.0;
  }
  if (min_pivot != (double *)0x0) {
    *min_pivot = 0.0;
  }
  if (zero_pivot != (double *)0x0) {
    *zero_pivot = 0.0;
  }
  local_1b8 = *points2d;
  adStack_a0[1] = local_1b8;
  dVar16 = points2d[1];
  adStack_a0[2] = dVar16;
  if (1.23432101234321e+308 <= ABS(local_1b8)) {
    return false;
  }
  if (1.23432101234321e+308 <= ABS(dVar16)) {
    return false;
  }
  pdVar9 = points2d + (long)stride + 1;
  lVar13 = 0x18;
  dVar24 = dVar16;
  dVar17 = local_1b8;
  do {
    dVar18 = pdVar9[-1];
    *(double *)((long)adStack_a0 + lVar13) = dVar18;
    dVar20 = *pdVar9;
    *(double *)((long)adStack_a0 + lVar13 + 8) = dVar20;
    if (1.23432101234321e+308 <= ABS(dVar18)) {
      return false;
    }
    if (1.23432101234321e+308 <= ABS(dVar20)) {
      return false;
    }
    dVar19 = dVar18;
    if ((dVar17 <= dVar18) && (dVar19 = dVar17, local_1b8 < dVar18)) {
      local_1b8 = dVar18;
    }
    dVar18 = dVar20;
    if ((dVar24 <= dVar20) && (dVar18 = dVar24, dVar16 < dVar20)) {
      dVar16 = dVar20;
    }
    lVar13 = lVar13 + 0x10;
    pdVar9 = pdVar9 + stride;
    dVar24 = dVar18;
    dVar17 = dVar19;
  } while (lVar13 != 0x68);
  local_1b8 = local_1b8 - dVar19;
  dVar16 = dVar16 - dVar18;
  if (dVar16 <= local_1b8) {
    if (local_1b8 <= 0.0) {
      return false;
    }
    dVar24 = (dVar16 / local_1b8) * (dVar16 / local_1b8);
  }
  else {
    dVar24 = (local_1b8 / dVar16) * (local_1b8 / dVar16);
    local_1b8 = dVar16;
  }
  dVar24 = dVar24 + 1.0;
  if (dVar24 < 0.0) {
    uStack_1b0 = 0;
    adStack_2a8[3] = 2.86558222807617e-317;
    dVar24 = sqrt(dVar24);
  }
  else {
    dVar24 = SQRT(dVar24);
  }
  dVar17 = adStack_a0[0xc];
  dVar16 = adStack_a0[0xb];
  if (0.0 < local_1b8 * dVar24) {
    dVar24 = 1.0 / (local_1b8 * dVar24);
    pdVar9 = adStack_a0;
    lVar13 = 0x20;
    do {
      pdVar9 = pdVar9 + 2;
      dVar18 = (pdVar9[-1] - dVar16) * dVar24;
      dVar20 = (*pdVar9 - dVar17) * dVar24;
      *(double *)((long)adStack_2a8 + lVar13) = dVar18 * dVar18;
      *(double *)((long)adStack_2a8 + lVar13 + 8) = dVar18 * dVar20;
      *(double *)((long)adStack_2a8 + lVar13 + 0x10) = dVar20 * dVar20;
      *(double *)((long)adStack_2a8 + lVar13 + 0x18) = dVar18;
      *(double *)((long)adStack_2a8 + lVar13 + 0x20) = dVar20;
      lVar13 = lVar13 + 0x28;
    } while (lVar13 != 0xe8);
    pdVar9 = adStack_170 + 1;
    uVar12 = 0;
    adStack_2a8[3] = 2.86567857087711e-317;
    local_1b8 = dVar24;
    memset(pdVar9,0,200);
    local_a8 = 1.0;
    local_d8 = 0x3ff0000000000000;
    local_108 = 0x3ff0000000000000;
    local_138 = 0x3ff0000000000000;
    adStack_170[1] = 1.0;
    uVar5 = 0;
    dVar16 = ABS(adStack_2a8[4]);
    do {
      lVar13 = uVar12 + 5;
      uVar12 = uVar12 + 1;
      dVar17 = ABS(adStack_2a8[lVar13]);
      dVar24 = dVar17;
      if (dVar17 <= dVar16) {
        dVar24 = dVar16;
      }
      if (dVar16 < dVar17) {
        uVar5 = uVar12 & 0xffffffff;
      }
      dVar16 = dVar24;
    } while ((int)uVar12 != 0x18);
    if ((dVar24 != 0.0) || (NAN(dVar24))) {
      iVar4 = (int)uVar5;
      if (8 < iVar4 + 4U) {
        lVar13 = 0;
        do {
          dVar16 = adStack_2a8[lVar13 + 4];
          adStack_2a8[lVar13 + 4] = adStack_2a8[(long)(iVar4 / 5) * 5 + lVar13 + 4];
          adStack_2a8[(long)(iVar4 / 5) * 5 + lVar13 + 4] = dVar16;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 5);
      }
      if (iVar4 % 5 != 0) {
        lVar7 = (long)(iVar4 % 5);
        lVar13 = lVar7 * 8 + -0x288;
        lVar10 = 0;
        do {
          uVar1 = *(undefined8 *)((long)adStack_2a8 + lVar10 + 0x20);
          *(undefined8 *)((long)adStack_2a8 + lVar10 + 0x20) =
               *(undefined8 *)((long)adStack_2a8 + lVar10 + lVar13 + 0x2a8);
          *(undefined8 *)((long)adStack_2a8 + lVar10 + lVar13 + 0x2a8) = uVar1;
          uVar1 = *(undefined8 *)((long)adStack_170 + lVar10 + 8U);
          *(undefined8 *)((long)adStack_170 + lVar10 + 8U) =
               *(undefined8 *)((long)adStack_170 + lVar10 + lVar7 * 8 + 8U);
          *(undefined8 *)((long)adStack_170 + lVar10 + lVar7 * 8 + 8U) = uVar1;
          lVar10 = lVar10 + 0x28;
        } while (lVar10 != 200);
      }
      dVar16 = 1.0 / adStack_2a8[4];
      adStack_2a8[4] = 1.0;
      adStack_2a8[5] = adStack_2a8[5] * dVar16;
      adStack_2a8[6] = adStack_2a8[6] * dVar16;
      adStack_2a8[7] = adStack_2a8[7] * dVar16;
      adStack_2a8[8] = dVar16 * adStack_2a8[8];
      lVar13 = 0x48;
      do {
        dVar16 = *(double *)((long)adStack_2a8 + lVar13);
        if ((dVar16 != 0.0) || (NAN(dVar16))) {
          *(undefined8 *)((long)adStack_2a8 + lVar13) = 0;
          *(double *)((long)adStack_2a8 + lVar13 + 8) =
               *(double *)((long)adStack_2a8 + lVar13 + 8) - dVar16 * adStack_2a8[5];
          *(double *)((long)adStack_2a8 + lVar13 + 0x10) =
               *(double *)((long)adStack_2a8 + lVar13 + 0x10) - dVar16 * adStack_2a8[6];
          *(double *)((long)adStack_2a8 + lVar13 + 0x18) =
               *(double *)((long)adStack_2a8 + lVar13 + 0x18) - dVar16 * adStack_2a8[7];
          *(double *)((long)adStack_2a8 + lVar13 + 0x20) =
               *(double *)((long)adStack_2a8 + lVar13 + 0x20) - dVar16 * adStack_2a8[8];
        }
        lVar13 = lVar13 + 0x28;
      } while (lVar13 != 0xe8);
      dVar16 = ABS(local_258[0]);
      uVar5 = 6;
      lVar13 = 0;
      do {
        if (dVar16 < ABS(local_258[lVar13 + 1])) {
          uVar5 = (ulong)((int)lVar13 + 7);
          dVar16 = ABS(local_258[lVar13 + 1]);
        }
        lVar13 = lVar13 + 1;
      } while ((int)lVar13 != 0x12);
      dVar17 = dVar16;
      if (dVar16 <= dVar24) {
        dVar17 = dVar24;
      }
      if ((dVar16 != 0.0) || (NAN(dVar16))) {
        uVar6 = (int)uVar5 % 5;
        if (9 < (int)uVar5) {
          lVar13 = 0;
          do {
            dVar16 = local_258[lVar13];
            local_258[lVar13] = adStack_2a8[(uVar5 / 5) * 5 + lVar13 + 5];
            adStack_2a8[(uVar5 / 5) * 5 + lVar13 + 5] = dVar16;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 4);
        }
        if (1 < (int)uVar6) {
          uVar5 = (ulong)uVar6;
          lVar13 = uVar5 * 8 + -0x288;
          lVar7 = 0;
          do {
            uVar1 = *(undefined8 *)((long)adStack_2a8 + lVar7 + 0x28);
            *(undefined8 *)((long)adStack_2a8 + lVar7 + 0x28) =
                 *(undefined8 *)((long)adStack_2a8 + lVar7 + lVar13 + 0x2a8);
            *(undefined8 *)((long)adStack_2a8 + lVar7 + lVar13 + 0x2a8) = uVar1;
            uVar1 = *(undefined8 *)((long)adStack_170 + lVar7 + 0x10U);
            *(undefined8 *)((long)adStack_170 + lVar7 + 0x10U) =
                 *(undefined8 *)((long)adStack_170 + lVar7 + uVar5 * 8 + 8);
            *(undefined8 *)((long)adStack_170 + lVar7 + uVar5 * 8 + 8) = uVar1;
            lVar7 = lVar7 + 0x28;
          } while (lVar7 != 200);
        }
        dVar16 = 1.0 / local_258[0];
        local_258[0] = 1.0;
        local_258[1] = local_258[1] * dVar16;
        local_258[2] = local_258[2] * dVar16;
        local_258[3] = dVar16 * local_258[3];
        lVar13 = 0;
        do {
          dVar16 = *(double *)((long)adStack_230 + lVar13);
          if ((dVar16 != 0.0) || (NAN(dVar16))) {
            *(undefined8 *)((long)adStack_230 + lVar13) = 0;
            *(double *)((long)adStack_230 + lVar13 + 8) =
                 *(double *)((long)adStack_230 + lVar13 + 8) - local_258[1] * dVar16;
            *(double *)((long)adStack_230 + lVar13 + 0x10) =
                 *(double *)((long)adStack_230 + lVar13 + 0x10) - local_258[2] * dVar16;
            *(double *)((long)adStack_230 + lVar13 + 0x18) =
                 *(double *)((long)adStack_230 + lVar13 + 0x18) - dVar16 * local_258[3];
          }
          lVar13 = lVar13 + 0x28;
        } while (lVar13 != 0x78);
        dVar16 = ABS(adStack_230[1]);
        uVar5 = 0xc;
        lVar13 = 0;
        do {
          if (dVar16 < ABS(adStack_230[lVar13 + 2])) {
            uVar5 = (ulong)((int)lVar13 + 0xd);
            dVar16 = ABS(adStack_230[lVar13 + 2]);
          }
          lVar13 = lVar13 + 1;
        } while ((int)lVar13 != 0xc);
        dVar24 = dVar16;
        if (dVar16 <= dVar17) {
          dVar24 = dVar17;
        }
        if ((dVar16 == 0.0) && (!NAN(dVar16))) {
          if (max_pivot == (double *)0x0) {
            return false;
          }
          *max_pivot = dVar24;
          return false;
        }
        uVar6 = (int)uVar5 % 5;
        if (0xe < (int)uVar5) {
          lVar13 = 0;
          do {
            dVar16 = adStack_230[lVar13 + 1];
            adStack_230[lVar13 + 1] = local_258[(uVar5 / 5) * 5 + lVar13 + -4];
            local_258[(uVar5 / 5) * 5 + lVar13 + -4] = dVar16;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
        }
        if (2 < (int)uVar6) {
          uVar5 = (ulong)uVar6;
          lVar13 = uVar5 * 8 + -0x288;
          lVar7 = 0;
          do {
            uVar1 = *(undefined8 *)((long)adStack_2a8 + lVar7 + 0x30);
            *(undefined8 *)((long)adStack_2a8 + lVar7 + 0x30) =
                 *(undefined8 *)((long)adStack_2a8 + lVar7 + lVar13 + 0x2a8);
            *(undefined8 *)((long)adStack_2a8 + lVar7 + lVar13 + 0x2a8) = uVar1;
            uVar1 = *(undefined8 *)((long)adStack_170 + lVar7 + 0x18U);
            *(undefined8 *)((long)adStack_170 + lVar7 + 0x18U) =
                 *(undefined8 *)((long)adStack_170 + lVar7 + uVar5 * 8 + 8);
            *(undefined8 *)((long)adStack_170 + lVar7 + uVar5 * 8 + 8) = uVar1;
            lVar7 = lVar7 + 0x28;
          } while (lVar7 != 200);
        }
        dVar16 = 1.0 / adStack_230[1];
        adStack_230[1] = 1.0;
        adStack_230[2] = adStack_230[2] * dVar16;
        adStack_230[3] = dVar16 * adStack_230[3];
        lVar13 = 0;
        do {
          dVar16 = *(double *)((long)adStack_230 + lVar13 + 0x30);
          if ((dVar16 != 0.0) || (NAN(dVar16))) {
            *(undefined8 *)((long)adStack_230 + lVar13 + 0x30) = 0;
            *(double *)((long)adStack_230 + lVar13 + 0x38) =
                 *(double *)((long)adStack_230 + lVar13 + 0x38) - adStack_230[2] * dVar16;
            *(double *)((long)adStack_230 + lVar13 + 0x40) =
                 *(double *)((long)adStack_230 + lVar13 + 0x40) - dVar16 * adStack_230[3];
          }
          dVar18 = adStack_230[8];
          dVar16 = adStack_230[7];
          lVar13 = lVar13 + 0x28;
        } while (lVar13 != 0x50);
        dVar19 = ABS(adStack_230[7]);
        dVar22 = ABS(adStack_230[8]);
        dVar20 = dVar22;
        if (dVar22 <= dVar19) {
          dVar20 = dVar19;
        }
        dVar25 = ABS(local_1d0);
        dVar21 = dVar25;
        if (dVar25 <= dVar20) {
          dVar21 = dVar20;
        }
        dVar23 = ABS(local_1c8);
        dVar2 = dVar23;
        if (dVar23 <= dVar21) {
          dVar2 = dVar21;
        }
        dVar17 = dVar2;
        if (dVar2 <= dVar24) {
          dVar17 = dVar24;
        }
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          if ((dVar20 < dVar25) || (dVar21 < dVar23)) {
            adStack_230[7] = local_1d0;
            local_1d0 = dVar16;
            adStack_230[8] = local_1c8;
            local_1c8 = dVar18;
          }
          if ((dVar19 < dVar22 && dVar25 <= dVar20) || (dVar21 < dVar23)) {
            lVar13 = 0x20;
            do {
              uVar1 = *(undefined8 *)((long)adStack_2a8 + lVar13 + 0x18);
              *(undefined8 *)((long)adStack_2a8 + lVar13 + 0x18) =
                   *(undefined8 *)((long)adStack_2a8 + lVar13 + 0x20);
              *(undefined8 *)((long)adStack_2a8 + lVar13 + 0x20) = uVar1;
              uVar1 = *(undefined8 *)((long)adStack_170 + lVar13);
              *(undefined8 *)((long)adStack_170 + lVar13) =
                   *(undefined8 *)((long)adStack_170 + lVar13 + 8U);
              *(undefined8 *)((long)adStack_170 + lVar13 + 8U) = uVar1;
              lVar13 = lVar13 + 0x28;
            } while (lVar13 != 0xe8);
          }
          dVar16 = 1.0 / adStack_230[7];
          adStack_230[7] = 1.0;
          adStack_230[8] = dVar16 * adStack_230[8];
          if ((local_1d0 != 0.0) || (NAN(local_1d0))) {
            local_1c8 = local_1c8 - local_1d0 * adStack_230[8];
            local_1d0 = 0.0;
          }
          if (max_pivot != (double *)0x0) {
            *max_pivot = dVar17;
          }
          if (min_pivot != (double *)0x0) {
            *min_pivot = dVar17;
          }
          if (zero_pivot != (double *)0x0) {
            *zero_pivot = ABS(local_1c8);
          }
          lVar7 = 1;
          pdVar8 = adStack_170 + 2;
          lVar13 = 0;
          do {
            lVar11 = lVar13 + 1;
            pdVar14 = pdVar8;
            lVar10 = lVar7;
            do {
              dVar16 = adStack_2a8[lVar13 * 5 + lVar10 + 4];
              dVar24 = -dVar16;
              if ((dVar16 != dVar24) || (NAN(dVar16) || NAN(dVar24))) {
                lVar15 = 0;
                do {
                  *(double *)((long)pdVar14 + lVar15) =
                       *(double *)((long)pdVar9 + lVar15) * dVar24 +
                       *(double *)((long)pdVar14 + lVar15);
                  lVar15 = lVar15 + 0x28;
                } while (lVar15 != 200);
              }
              lVar10 = lVar10 + 1;
              pdVar14 = pdVar14 + 1;
            } while (lVar10 != 5);
            lVar7 = lVar7 + 1;
            pdVar9 = pdVar9 + 1;
            pdVar8 = pdVar8 + 1;
            lVar13 = lVar11;
          } while (lVar11 != 4);
          local_178 = adStack_170[5];
          adStack_170[0] = 0.0;
          local_188 = local_120;
          uStack_180 = 0;
          local_1a0 = local_f8;
          local_198 = local_d0;
          local_190 = local_a8;
          adStack_2a8[3] = 2.86669140545108e-317;
          bVar3 = ON_IsDegenrateConicHelper(adStack_170[5],local_120,local_f8,local_d0,local_a8);
          if (bVar3) {
            return false;
          }
          dVar16 = local_1b8 * local_1b8;
          local_178 = local_178 * dVar16;
          local_188 = local_188 * dVar16;
          dVar16 = dVar16 * local_1a0;
          dVar24 = local_188 * -adStack_a0[0xb];
          dVar18 = ((dVar16 * adStack_a0[0xc] * adStack_a0[0xc] +
                    (local_178 * adStack_a0[0xb] * adStack_a0[0xb] - dVar24 * adStack_a0[0xc])) -
                   adStack_a0[0xb] * local_198 * local_1b8) -
                   local_190 * local_1b8 * adStack_a0[0xc];
          dVar20 = ((local_178 + local_178) * -adStack_a0[0xb] - local_188 * adStack_a0[0xc]) +
                   local_198 * local_1b8;
          dVar17 = (dVar24 - (dVar16 + dVar16) * adStack_a0[0xc]) + local_190 * local_1b8;
          dVar24 = local_178;
          if (ABS(local_178) < ABS(dVar16)) {
            dVar24 = dVar16;
          }
          if (dVar24 < 0.0) {
            local_178 = -local_178;
            local_188 = -local_188;
            dVar16 = -dVar16;
            dVar20 = -dVar20;
            dVar17 = -dVar17;
            dVar18 = -dVar18;
          }
          *conic = local_178;
          conic[1] = local_188;
          conic[2] = dVar16;
          conic[3] = dVar20;
          conic[4] = dVar17;
          conic[5] = dVar18;
          dVar24 = ABS(local_178);
          uVar12 = 0;
          uVar5 = 0;
          do {
            if (dVar24 < ABS(conic[uVar12])) {
              uVar5 = uVar12 & 0xffffffff;
              dVar24 = ABS(conic[uVar12]);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != 6);
          dVar24 = conic[(int)uVar5];
          if ((dVar24 == 0.0) && (!NAN(dVar24))) {
            return (bool)(-(dVar24 != 0.0) & 1);
          }
          dVar24 = 1.0 / dVar24;
          *conic = local_178 * dVar24;
          conic[1] = local_188 * dVar24;
          conic[2] = dVar16 * dVar24;
          conic[3] = dVar20 * dVar24;
          conic[4] = dVar17 * dVar24;
          conic[5] = dVar18 * dVar24;
          conic[(int)uVar5] = 1.0;
          return true;
        }
      }
      if (max_pivot != (double *)0x0) {
        *max_pivot = dVar17;
      }
    }
  }
  return false;
}

Assistant:

bool ON_GetConicEquationThrough6Points( 
        int stride, 
        const double* points2d, 
        double conic[6],
        double* max_pivot,
        double* min_pivot,
        double* zero_pivot
        )
{
  // Sets conic[] to the coefficients = (A,B,C,D,E,F),
  // such that A*x*x + B*x*y + C*y*y + D*x + E*y + F = 0
  // for each of the 6 input points.

  // This code is long and ugly.  The reason for unrolling the 
  // obvious loops is to make it as efficient as possible.  
  // Rhino calls this function in time critical situations.
  //

  ON_2dPoint pts[6], bboxmin, bboxmax;
  double scale, x, y, M[5][5], N[5][5], max_piv, min_piv;
  const double* p;
  int i, j, k;

  if ( 0 == conic )
    return false;
  memset(conic,0,6*sizeof(conic[0]));
  if ( max_pivot )
    *max_pivot = 0.0;
  if ( min_pivot )
    *min_pivot = 0.0;
  if ( zero_pivot )
    *zero_pivot = 0.0;

  // copy input points into pts[6] and calculate bounding box
  bboxmin.x = bboxmax.x = pts[0].x = points2d[0];
  bboxmin.y = bboxmax.y = pts[0].y = points2d[1];
  if ( !pts[0].IsValid() )
    return false;
  for ( i = 1; i < 6; i++ )
  {
    points2d += stride;
    pts[i].x = points2d[0];
    pts[i].y = points2d[1];
    if ( !pts[i].IsValid() )
      return false;
    if ( pts[i].x < bboxmin.x ) bboxmin.x = pts[i].x; 
    else if ( pts[i].x > bboxmax.x ) bboxmax.x = pts[i].x;
    if ( pts[i].y < bboxmin.y ) bboxmin.y = pts[i].y; 
    else if ( pts[i].y > bboxmax.y ) bboxmax.y = pts[i].y;
  }

  // translate and scale pts[] so pts[5] is at the origin and
  // (pts[0],...pts[4]) have and have a "diameter" near 1.
  // This keeps the starting coefficients in M[][] less than 5
  // with the largest generally near one.
  x = bboxmax.x-bboxmin.x;
  y = bboxmax.y-bboxmin.y;
  if ( x >= y )
  {
    if ( x > 0.0 )
    {
      y /= x;
      scale = x*sqrt(1.0 + y*y);
    }
    else
      return false;
  }
  else 
  {
    x /= y;
    scale = y*sqrt(1.0 + x*x);
  }
  if ( scale > 0.0 )
    scale = 1.0/scale;
  else
    return false;

  for ( i = 0; i < 5; i++ )
  {
    x = scale*(pts[i].x - pts[5].x);
    y = scale*(pts[i].y - pts[5].y);
    M[i][0] = x*x;
    M[i][1] = x*y;
    M[i][2] = y*y;
    M[i][3] = x;
    M[i][4] = y;
  }

  memset( N,0,sizeof(N) );
  N[0][0] = N[1][1] = N[2][2] = N[3][3] = N[4][4] = 1.0;

  // The conic (A,B,C,D,E) is the kernel of M.

  //////////////////////////////////////////////////////////
  //
  // find first pivot
  //
  j = 0;
  p = &M[0][0];
  x = fabs(*p);
  for ( i = 1; i < 25; i++ )
  {
    if ( x < (y = fabs(*(++p))) )
    {
      x = y;
      j = i;
    }
  }
  max_piv = min_piv = x;
  if ( 0.0 == x )
    return false; // all input points are equal
  i = j/5;
  j %= 5;

  if ( 0 != i )
  {
    // swap rows M[0][] and M[i][]
    // Do not modify N because row ops act on the left of M.
    for ( k = 0; k < 5; k++ )
    {
      y = M[0][k]; M[0][k] = M[i][k]; M[i][k] = y;
    }
  }
  if ( 0 != j )
  {
    // Swap columns M[][0] and M[][j]
    // Also swap N[][] columns because column swap
    // matrix acts on the right of M.
    for ( k = 0; k < 5; k++ )
    {
      y = M[k][0]; M[k][0] = M[k][j]; M[k][j] = y;
      y = N[k][0]; N[k][0] = N[k][j]; N[k][j] = y;
    }
  }

  // scale row M[0][] so that M[0][0] = 1.
  // Do not modify N because row ops act on the left of M.
  x = 1.0/M[0][0];
  M[0][0] = 1.0; 
  M[0][1] *= x; M[0][2] *= x; M[0][3] *= x; M[0][4] *= x;

  // kill column M[1,2,3,4][0]
  for ( i = 1; i < 5; i++)
  {
    if ( 0.0 != (y = -M[i][0]) )
    {
      // use row op M[i][] += y*M[0][]
      // Do not modify N because row ops act on the left of M.
      M[i][0] = 0.0; // set to zero so search for pivot is faster
      M[i][1] += y*M[0][1]; M[i][2] += y*M[0][2]; M[i][3] += y*M[0][3]; M[i][4] += y*M[0][4];
    }
  }


  //////////////////////////////////////////////////////////
  //
  // find second pivot
  //
  j = 6;
  p = &M[1][1];
  x = fabs(*p);
  for ( i = 7; i < 25; i++ )
  {
    if ( x < (y = fabs(*(++p))) )
    {
      x = y;
      j = i;
    }
  }
  if ( x > max_piv ) max_piv = x; else if ( x < min_piv ) min_piv = x;
  if ( 0.0 == x )
  {
    if ( 0 != max_pivot )
      *max_pivot = max_piv;
    return false; // two distinct points in input point list.
  }
  i = j/5;  // should always be >= 1
  j %= 5;   // should always be >= 1

  if ( i > 1 )
  {
    // swap rows M[1][] and M[i][]
    // Do not modify N because row ops act on the left of M.
    for ( k = 1; k < 5; k++ )
    {
      y = M[1][k]; M[1][k] = M[i][k]; M[i][k] = y;
    }
  }
  if ( j > 1 )
  {
    // Swap columns M[][1] and M[][j]
    // Also swap N[][] columns because column swap
    // matrix acts on the right of M.
    for ( k = 0; k < 5; k++ )
    {
      y = M[k][1]; M[k][1] = M[k][j]; M[k][j] = y;
      y = N[k][1]; N[k][1] = N[k][j]; N[k][j] = y;
    }
  }

  // scale row M[1][] so that M[1][1] = 1.
  // Do not modify N because row ops act on the left of M.
  x = 1.0/M[1][1];
  M[1][1] = 1.0; 
  M[1][2] *= x; M[1][3] *= x; M[1][4] *= x;

  // kill column M[2,3,4][1]
  for ( i = 2; i < 5; i++)
  {
    if ( 0.0 != (y = -M[i][1]) )
    {
      // use row op M[i][] += y*M[0][]
      // Do not modify N because row ops act on the left of M.
      M[i][1] = 0.0; // set to zero so search for pivot is faster
      M[i][2] += y*M[1][2]; M[i][3] += y*M[1][3]; M[i][4] += y*M[1][4];
    }
  }


  //////////////////////////////////////////////////////////
  //
  // find third pivot
  //
  j = 12;
  p = &M[2][2];
  x = fabs(*p);
  for ( i = 13; i < 25; i++ )
  {
    if ( x < (y = fabs(*(++p))) )
    {
      x = y;
      j = i;
    }
  }
  if ( x > max_piv ) max_piv = x; else if ( x < min_piv ) min_piv = x;
  if ( 0.0 == x )
  {
    if ( 0 != max_pivot )
      *max_pivot = max_piv;
    return false; // three distinct points in input point list.
  }
  i = j/5;  // should always be >= 2
  j %= 5;   // should always be >= 2

  if ( i > 2 )
  {
    // swap rows M[2][] and M[i][]
    // Do not modify N because row ops act on the left of M.
    for ( k = 2; k < 5; k++ )
    {
      y = M[2][k]; M[2][k] = M[i][k]; M[i][k] = y;
    }
  }
  if ( j > 2 )
  {
    // Swap columns M[][2] and M[][j]
    // Also swap N[][] columns because column swap
    // matrix acts on the right of M.
    for ( k = 0; k < 5; k++ )
    {
      y = M[k][2]; M[k][2] = M[k][j]; M[k][j] = y;
      y = N[k][2]; N[k][2] = N[k][j]; N[k][j] = y;
    }
  }

  // scale row M[2][] so that M[2][2] = 1.
  // Do not modify N because row ops act on the left of M.
  x = 1.0/M[2][2];
  M[2][2] = 1.0; M[2][3] *= x; M[2][4] *= x;

  // kill column M[3,4][2]
  for ( i = 3; i < 5; i++)
  {
    if ( 0.0 != (y = -M[i][2]) )
    {
      // use row op M[i][] += y*M[0][]
      // Do not modify N because row ops act on the left of M.
      M[i][2] = 0.0; // set to zero so search for pivot is faster
      M[i][3] += y*M[2][3]; M[i][4] += y*M[2][4];
    }
  }

  //////////////////////////////////////////////////////////
  //
  // find fourth pivot
  //
  i = j = 3;
  x = fabs(M[3][3]);
  if ( x < (y = fabs(M[3][4])) )
  {
    x = y; j = 4;
  }
  if ( x < (y = fabs(M[4][3])) )
  {
    x = y; i = 4; j = 3;
  }
  if ( x < (y = fabs(M[4][4])) )
  {
    x = y; i = j = 4;
  }
  if ( x > max_piv ) max_piv = x; else if ( x < min_piv ) min_piv = x;
  if ( 0.0 == x )
  {
    if ( 0 != max_pivot )
      *max_pivot = max_piv;
    return false; // four distinct points in the input point list.
  }

  if ( i > 3 )
  {
    // swap rows M[3][] and M[i][]
    // Do not modify N[][] because row ops act on the left of M.
    y = M[3][3]; M[3][3] = M[4][3]; M[4][3] = y;
    y = M[3][4]; M[3][4] = M[i][4]; M[4][4] = y;
  }
  if ( j > 3 )
  {
    // Swap columns M[][3] and M[][j]
    // Also swap N[][] columns because column swap
    // matrix acts on the right of M.
    for ( k = 0; k < 5; k++ )
    {
      y = M[k][3]; M[k][3] = M[k][4]; M[k][4] = y;
      y = N[k][3]; N[k][3] = N[k][4]; N[k][4] = y;
    }
  }

  // scale row M[3][] so that M[3][3] = 1.
  // Do not modify N because row ops act on the left of M.
  x = 1.0/M[3][3];
  M[3][3] = 1.0; 
  M[3][4] *= x;

  // kill column M[4][3]
  if ( 0.0 != M[4][3] )
  {
    // use row op M[i][] += y*M[3][]
    // Do not modify N because row ops act on the left of M.
    M[4][4] -= M[4][3]*M[3][4];
    M[4][3] = 0.0; // set to zero so search for pivot is faster
  }

  // By construction, M[][] is singular and M[4][4] should be nearly zero.
  // It should be upper triangular with diagonal 1,1,1,1,0-ish
  if ( max_pivot )
    *max_pivot = max_piv;
  if ( min_pivot )
    *min_pivot = max_piv;
  if ( zero_pivot )
    *zero_pivot = fabs(M[4][4]);

  // Use column operations to make M[][] the identity.
  // The operations must also be applied to N[][] in order to
  // calculate the kernel of the original M[][].
  for ( i = 0; i < 4; i++ )
  {
    for (j = i+1; j < 5; j++ )
    {
      if ( 0.0 != (y = -M[i][j]) )
      {
        // waste of time // M[i][j] = 0.0;
        for ( k = 0; k < 5; k++ )
        {
          //M[k][j] += y*M[k][i];
          N[k][j] += y*N[k][i];
        }
      }
    }
  }

  // At this point, M[][] should be reduced to a diagonal matrix with 
  // 1,1,1,1,0 on the diagonal. The vector (A,B,C,D,E) = N*Transpose(0,0,0,0,1)
  // will be in the kernel of the original M[][]. The conic through the 
  // six points( scale*(pts[0]-pts[5]),...,scale*(pts[4]-pts[5]),(0,0) ) 
  // is Ax^2 + Bxy + Cy^2 + Dx + Ey = 0.
  // We need to apply the inverse of the scale and then translate by 
  // (pts[5].x,pts[5].y) to get the equation of the conic through the 
  // input point list.

  double A = N[0][4];
  double B = N[1][4];
  double C = N[2][4];
  double D = N[3][4];
  double E = N[4][4];
  // F = 0

  // check for collinear point set
  if ( ON_IsDegenrateConicHelper(A,B,C,D,E) )
  {
    // points lie on one or two lines
    return false;
  }

  // points are not collinear

  // undo the scale we applied when we calculated M[][]
  x = scale*scale;
  A *= x;
  B *= x;
  C *= x;
  D *= scale;
  E *= scale;

  // undo the translation of pts[5] to (0,0) we applied when we calculated M[][]
  x = -pts[5].x;
  y = -pts[5].y;
  double F = A*x*x + B*x*y + C*y*y + D*x + E*y;
  D += 2.0*A*x + B*y;
  E += 2.0*C*y + B*x;

  if ( (fabs(A) >= fabs(C)) ? (A<0.0):(C<0.0) )
  {
    // Make the largest A/C coefficient positive.
    A = -A; B = -B; C = -C; D = -D; E = -E; F = -F;
  }

  conic[0] = A; conic[1] = B; conic[2] = C;
  conic[3] = D; conic[4] = E; conic[5] = F;

  //
  j = 0;
  x = fabs(conic[0]);
  for ( i = 0; i < 6; i++ )
  {
    if ( x < (y = fabs(conic[i])) )
    {
      x = y;
      j = i;
    }
  }
  if ( !(conic[j] != 0.0) )
    return false;
  y = 1.0/conic[j];
  conic[0] *= y; conic[1] *= y; conic[2] *= y; 
  conic[3] *= y; conic[4] *= y; conic[5] *= y; 
  conic[j] = 1.0;

  return true;
}